

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O2

void drmp3_L3_imdct36(float *grbuf,float *overlap,float *window,int nbands)

{
  float *pfVar1;
  float fVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  bool bVar24;
  bool bVar25;
  int iVar26;
  float *pfVar27;
  long lVar28;
  float *pfVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float si [9];
  float co [9];
  
  iVar26 = 0;
  if (nbands < 1) {
    nbands = 0;
  }
  for (; iVar26 != nbands; iVar26 = iVar26 + 1) {
    co[0] = -*grbuf;
    si[0] = grbuf[0x11];
    pfVar27 = si + 7;
    for (lVar28 = 0; lVar28 != 0x20; lVar28 = lVar28 + 8) {
      fVar2 = *(float *)((long)grbuf + lVar28 * 2 + 4);
      fVar32 = *(float *)((long)grbuf + lVar28 * 2 + 0x10);
      uVar3 = *(undefined8 *)((long)grbuf + lVar28 * 2 + 8);
      fVar30 = (float)uVar3;
      *(float *)((long)co + lVar28 + 4) = fVar2 + fVar30;
      fVar31 = (float)((ulong)uVar3 >> 0x20);
      *(ulong *)pfVar27 = CONCAT44(fVar2 - fVar30,fVar32 - fVar31);
      *(float *)((long)co + lVar28 + 8) = -(fVar31 + fVar32);
      pfVar27 = pfVar27 + -2;
    }
    drmp3_L3_dct3_9(co);
    drmp3_L3_dct3_9(si);
    si[1] = -si[1];
    si[3] = -si[3];
    si[5] = -si[5];
    si[7] = -si[7];
    lVar28 = 0;
    pfVar27 = si;
    pfVar29 = co;
    bVar24 = true;
    do {
      bVar25 = bVar24;
      pfVar1 = overlap + lVar28;
      fVar2 = *pfVar1;
      fVar32 = pfVar1[1];
      fVar30 = pfVar1[2];
      fVar31 = pfVar1[3];
      fVar4 = pfVar29[1];
      fVar5 = pfVar29[2];
      fVar6 = pfVar29[3];
      fVar7 = pfVar27[1];
      fVar8 = pfVar27[2];
      fVar9 = pfVar27[3];
      fVar10 = drmp3_L3_imdct36::g_twid9[lVar28 + 1];
      fVar11 = drmp3_L3_imdct36::g_twid9[lVar28 + 2];
      fVar12 = drmp3_L3_imdct36::g_twid9[lVar28 + 3];
      fVar13 = drmp3_L3_imdct36::g_twid9[lVar28 + 10];
      fVar14 = drmp3_L3_imdct36::g_twid9[lVar28 + 0xb];
      fVar15 = drmp3_L3_imdct36::g_twid9[lVar28 + 0xc];
      pfVar1 = window + lVar28;
      fVar16 = *pfVar1;
      fVar17 = pfVar1[1];
      fVar18 = pfVar1[2];
      fVar19 = pfVar1[3];
      pfVar1 = window + lVar28 + 9;
      fVar20 = *pfVar1;
      fVar21 = pfVar1[1];
      fVar22 = pfVar1[2];
      fVar23 = pfVar1[3];
      fVar33 = *pfVar27 * drmp3_L3_imdct36::g_twid9[lVar28] +
               *pfVar29 * drmp3_L3_imdct36::g_twid9[lVar28 + 9];
      fVar34 = fVar7 * fVar10 + fVar4 * fVar13;
      fVar35 = fVar8 * fVar11 + fVar5 * fVar14;
      fVar36 = fVar9 * fVar12 + fVar6 * fVar15;
      pfVar1 = overlap + lVar28;
      *pfVar1 = *pfVar29 * drmp3_L3_imdct36::g_twid9[lVar28] -
                *pfVar27 * drmp3_L3_imdct36::g_twid9[lVar28 + 9];
      pfVar1[1] = fVar4 * fVar10 - fVar7 * fVar13;
      pfVar1[2] = fVar5 * fVar11 - fVar8 * fVar14;
      pfVar1[3] = fVar6 * fVar12 - fVar9 * fVar15;
      pfVar27 = grbuf + lVar28;
      *pfVar27 = fVar2 * fVar16 - fVar33 * fVar20;
      pfVar27[1] = fVar32 * fVar17 - fVar34 * fVar21;
      pfVar27[2] = fVar30 * fVar18 - fVar35 * fVar22;
      pfVar27[3] = fVar31 * fVar19 - fVar36 * fVar23;
      grbuf[0xe - lVar28] = fVar31 * fVar23 + fVar19 * fVar36;
      grbuf[0xf - lVar28] = fVar30 * fVar22 + fVar18 * fVar35;
      grbuf[0x10 - lVar28] = fVar32 * fVar21 + fVar17 * fVar34;
      grbuf[0x11 - lVar28] = fVar2 * fVar20 + fVar16 * fVar33;
      lVar28 = 4;
      pfVar27 = si + 4;
      pfVar29 = co + 4;
      bVar24 = false;
    } while (bVar25);
    fVar2 = overlap[8];
    fVar32 = co[8] * 0.04361938 + si[8] * 0.99904823;
    overlap[8] = co[8] * 0.99904823 + si[8] * -0.04361938;
    grbuf[8] = window[8] * fVar2 - window[0x11] * fVar32;
    grbuf[9] = fVar2 * window[0x11] + fVar32 * window[8];
    grbuf = grbuf + 0x12;
    overlap = overlap + 9;
  }
  return;
}

Assistant:

static void drmp3_L3_imdct36(float *grbuf, float *overlap, const float *window, int nbands)
{
    int i, j;
    static const float g_twid9[18] = {
            0.73727734f,0.79335334f,0.84339145f,0.88701083f,0.92387953f,0.95371695f,0.97629601f,0.99144486f,0.99904822f,0.67559021f,0.60876143f,0.53729961f,0.46174861f,0.38268343f,0.30070580f,0.21643961f,0.13052619f,0.04361938f
    };

    for (j = 0; j < nbands; j++, grbuf += 18, overlap += 9)
    {
        float co[9], si[9];
        co[0] = -grbuf[0];
        si[0] = grbuf[17];
        for (i = 0; i < 4; i++)
        {
            si[8 - 2*i] =   grbuf[4*i + 1] - grbuf[4*i + 2];
            co[1 + 2*i] =   grbuf[4*i + 1] + grbuf[4*i + 2];
            si[7 - 2*i] =   grbuf[4*i + 4] - grbuf[4*i + 3];
            co[2 + 2*i] = -(grbuf[4*i + 3] + grbuf[4*i + 4]);
        }
        drmp3_L3_dct3_9(co);
        drmp3_L3_dct3_9(si);

        si[1] = -si[1];
        si[3] = -si[3];
        si[5] = -si[5];
        si[7] = -si[7];

        i = 0;

#if DRMP3_HAVE_SIMD
        if (drmp3_have_simd()) for (; i < 8; i += 4)
            {
                drmp3_f4 vovl = DRMP3_VLD(overlap + i);
                drmp3_f4 vc = DRMP3_VLD(co + i);
                drmp3_f4 vs = DRMP3_VLD(si + i);
                drmp3_f4 vr0 = DRMP3_VLD(g_twid9 + i);
                drmp3_f4 vr1 = DRMP3_VLD(g_twid9 + 9 + i);
                drmp3_f4 vw0 = DRMP3_VLD(window + i);
                drmp3_f4 vw1 = DRMP3_VLD(window + 9 + i);
                drmp3_f4 vsum = DRMP3_VADD(DRMP3_VMUL(vc, vr1), DRMP3_VMUL(vs, vr0));
                DRMP3_VSTORE(overlap + i, DRMP3_VSUB(DRMP3_VMUL(vc, vr0), DRMP3_VMUL(vs, vr1)));
                DRMP3_VSTORE(grbuf + i, DRMP3_VSUB(DRMP3_VMUL(vovl, vw0), DRMP3_VMUL(vsum, vw1)));
                vsum = DRMP3_VADD(DRMP3_VMUL(vovl, vw1), DRMP3_VMUL(vsum, vw0));
                DRMP3_VSTORE(grbuf + 14 - i, DRMP3_VREV(vsum));
            }
#endif
        for (; i < 9; i++)
        {
            float ovl  = overlap[i];
            float sum  = co[i]*g_twid9[9 + i] + si[i]*g_twid9[0 + i];
            overlap[i] = co[i]*g_twid9[0 + i] - si[i]*g_twid9[9 + i];
            grbuf[i]      = ovl*window[0 + i] - sum*window[9 + i];
            grbuf[17 - i] = ovl*window[9 + i] + sum*window[0 + i];
        }
    }
}